

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O1

bool __thiscall HEkkDualRow::chooseFinalWorkGroupQuad(HEkkDualRow *this)

{
  HighsInt *__args;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer piVar7;
  iterator iVar8;
  pointer ppVar9;
  int8_t *piVar10;
  double *pdVar11;
  double *pdVar12;
  HEkk *pHVar13;
  pointer ppVar14;
  int iVar15;
  long lVar16;
  char cVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double selectTheta;
  double local_70;
  int local_54;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  vector<int,std::allocator<int>> *local_38;
  
  dVar1 = (this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  iVar3 = this->workCount;
  this->workCount = 0;
  local_48 = this->workDelta;
  piVar7 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7;
  }
  local_48 = ABS(local_48);
  uStack_40 = 0;
  local_70 = this->workTheta;
  local_38 = (vector<int,std::allocator<int>> *)&this->workGroup;
  local_54 = 0;
  iVar8._M_current =
       (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_38,iVar8,&local_54);
  }
  else {
    *iVar8._M_current = 0;
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar8._M_current + 1;
  }
  __args = &this->workCount;
  iVar15 = this->workCount;
  dVar21 = 1e-12;
  local_50 = 1e+100;
  uVar18 = SUB84(local_70,0);
  uVar19 = (undefined4)((ulong)local_70 >> 0x20);
  do {
    if (1e+18 < (double)CONCAT44(uVar19,uVar18) || (double)CONCAT44(uVar19,uVar18) == 1e+18) {
      selectTheta = (double)CONCAT44(uVar19,uVar18);
      goto LAB_0035c1a1;
    }
    iVar4 = *__args;
    if (iVar4 < iVar3) {
      ppVar9 = (this->workData).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar10 = this->workMove;
      pdVar11 = this->workDual;
      pdVar12 = this->workRange;
      lVar16 = (long)iVar3 - (long)iVar4;
      ppVar14 = ppVar9 + iVar4;
      selectTheta = 1e+100;
      do {
        iVar4 = ppVar14->first;
        dVar2 = ppVar14->second;
        dVar20 = (double)(int)piVar10[iVar4] * pdVar11[iVar4];
        if (dVar20 <= (double)CONCAT44(uVar19,uVar18) * dVar2) {
          iVar5 = *__args;
          *__args = iVar5 + 1;
          iVar6 = ppVar9[iVar5].first;
          ppVar9[iVar5].first = ppVar14->first;
          ppVar14->first = iVar6;
          dVar20 = ppVar9[iVar5].second;
          ppVar9[iVar5].second = dVar2;
          ppVar14->second = dVar20;
          dVar21 = dVar21 + dVar2 * pdVar12[iVar4];
        }
        else {
          dVar20 = dVar20 + dVar1;
          if (dVar20 < selectTheta * dVar2) {
            selectTheta = dVar20 / dVar2;
          }
        }
        ppVar14 = ppVar14 + 1;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    else {
      selectTheta = 1e+100;
    }
    iVar8._M_current =
         (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_38,iVar8,__args);
    }
    else {
      *iVar8._M_current = this->workCount;
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar8._M_current + 1;
    }
    iVar4 = *__args;
    if ((((iVar4 != iVar15) || (local_70 != selectTheta)) || (local_50 != selectTheta)) ||
       (NAN(local_50) || NAN(selectTheta))) {
      cVar17 = (iVar4 == iVar3 || local_48 <= dVar21) * '\x03';
      iVar15 = iVar4;
      local_70 = selectTheta;
      local_50 = selectTheta;
    }
    else {
      pHVar13 = this->ekk_instance_;
      cVar17 = '\x01';
      debugDualChuzcFailQuad0
                (pHVar13->options_,iVar4,&this->workData,
                 (pHVar13->lp_).num_row_ + (pHVar13->lp_).num_col_,this->workDual,selectTheta,
                 selectTheta,true);
    }
    uVar18 = SUB84(selectTheta,0);
    uVar19 = (undefined4)((ulong)selectTheta >> 0x20);
  } while (cVar17 == '\0');
  if (cVar17 == '\x03') {
LAB_0035c1a1:
    if (1 < (int)((ulong)((long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      return true;
    }
    pHVar13 = this->ekk_instance_;
    debugDualChuzcFailQuad1
              (pHVar13->options_,this->workCount,&this->workData,
               (pHVar13->lp_).num_row_ + (pHVar13->lp_).num_col_,this->workDual,selectTheta,true);
  }
  return false;
}

Assistant:

bool HEkkDualRow::chooseFinalWorkGroupQuad() {
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  HighsInt fullCount = workCount;
  workCount = 0;
  double totalChange = kInitialTotalChange;
  double selectTheta = workTheta;
  const double totalDelta = fabs(workDelta);
  workGroup.clear();
  workGroup.push_back(0);
  HighsInt prev_workCount = workCount;
  double prev_remainTheta = kInitialRemainTheta;
  double prev_selectTheta = selectTheta;

  while (selectTheta < kMaxSelectTheta) {
    double remainTheta = kInitialRemainTheta;
    for (HighsInt i = workCount; i < fullCount; i++) {
      HighsInt iCol = workData[i].first;
      double value = workData[i].second;
      double dual = workMove[iCol] * workDual[iCol];
      // Tight satisfy
      if (dual <= selectTheta * value) {
        swap(workData[workCount++], workData[i]);
        totalChange += value * (workRange[iCol]);
      } else if (dual + Td < remainTheta * value) {
        remainTheta = (dual + Td) / value;
      }
    }
    workGroup.push_back(workCount);

    // Update selectTheta with the value of remainTheta;
    selectTheta = remainTheta;
    // Check for no change in this loop - to prevent infinite loop
    if ((workCount == prev_workCount) && (prev_selectTheta == selectTheta) &&
        (prev_remainTheta == remainTheta)) {
      HighsInt num_var =
          ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
      debugDualChuzcFailQuad0(*ekk_instance_.options_, workCount, workData,
                              num_var, workDual, selectTheta, remainTheta,
                              true);
      return false;
    }
    // Record the initial values of workCount, remainTheta and selectTheta for
    // the next pass through the loop - to check for infinite loop condition
    prev_workCount = workCount;
    prev_remainTheta = remainTheta;
    prev_selectTheta = selectTheta;
    if (totalChange >= totalDelta || workCount == fullCount) break;
  }
  // Check that at least one group has been identified
  if ((HighsInt)workGroup.size() <= 1) {
    HighsInt num_var = ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
    debugDualChuzcFailQuad1(*ekk_instance_.options_, workCount, workData,
                            num_var, workDual, selectTheta, true);
    return false;
  }
  return true;
}